

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

int stripaccent(int code)

{
  uint uVar1;
  int acode;
  int code_local;
  
  acode = code;
  if (0x89 < code) {
    if (code == 0x8a) {
      acode = 0x53;
    }
    else if (code == 0x8e) {
      acode = 0x5a;
    }
    else if (code == 0x9a) {
      acode = 0x73;
    }
    else if (code == 0x9e) {
      acode = 0x7a;
    }
    else if (code == 0x9f) {
      acode = 0x59;
    }
    else if (code == 0xff) {
      acode = 0x79;
    }
    else if ((code & 0xc0U) != 0) {
      uVar1 = code & 0xdf;
      if ((uVar1 < 0xc0) || (0xc5 < uVar1)) {
        if (uVar1 == 199) {
          acode = 0x43;
        }
        else if ((uVar1 < 200) || (0xcb < uVar1)) {
          if ((uVar1 < 0xcc) || (0xcf < uVar1)) {
            if (uVar1 == 0xd0) {
              acode = (code & 0x20U) + 0x44;
            }
            else if (uVar1 == 0xd1) {
              acode = (code & 0x20U) + 0x4e;
            }
            else if (((uVar1 < 0xd2) || (0xd6 < uVar1)) && (uVar1 != 0xd8)) {
              if ((uVar1 < 0xd9) || (0xdc < uVar1)) {
                if (uVar1 == 0xdd) {
                  acode = (code & 0x20U) + 0x59;
                }
                else if (uVar1 == 0xde) {
                  acode = (code & 0x20U) + 0x50;
                }
              }
              else {
                acode = (code & 0x20U) + 0x55;
              }
            }
            else {
              acode = (code & 0x20U) + 0x4f;
            }
          }
          else {
            acode = (code & 0x20U) + 0x49;
          }
        }
        else {
          acode = (code & 0x20U) + 0x45;
        }
      }
      else {
        acode = (code & 0x20U) + 0x41;
      }
    }
  }
  return acode;
}

Assistant:

static int stripaccent(int code)
{
	if (code < 0x8a)
		return code;
	if (code == 0x8a)	// Latin capital letter S with caron
		return 'S';
	if (code == 0x8e)	// Latin capital letter Z with caron
		return 'Z';
	if (code == 0x9a)	// Latin small letter S with caron
		return 's';
	if (code == 0x9e)	// Latin small letter Z with caron
		return 'z';
	if (code == 0x9f)	// Latin capital letter Y with diaeresis
		return 'Y';
	if (code == 0xff)	// Latin small letter Y with diaeresis
		return 'y';
	// Every other accented character has the high two bits set.
	if ((code & 0xC0) == 0)
		return code;
	// Make lowercase characters uppercase so there are half as many tests.
	int acode = code & 0xDF;
	if (acode >= 0xC0 && acode <= 0xC5)		// A with accents
		return 'A' + (code & 0x20);
	if (acode == 0xC7)						// Cedilla
		return 'C' + (acode & 0x20);
	if (acode >= 0xC8 && acode <= 0xCB)		// E with accents
		return 'E' + (code & 0x20);
	if (acode >= 0xCC && acode <= 0xCF)		// I with accents
		return 'I' + (code & 0x20);
	if (acode == 0xD0)						// Eth
		return 'D' + (code & 0x20);
	if (acode == 0xD1)						// N with tilde
		return 'N' + (code & 0x20);
	if ((acode >= 0xD2 && acode <= 0xD6) ||	// O with accents
		acode == 0xD8)						// O with stroke
		return 'O' + (code & 0x20);
	if (acode >= 0xD9 && acode <= 0xDC)		// U with accents
		return 'U' + (code & 0x20);
	if (acode == 0xDD)						// Y with accute
		return 'Y' + (code & 0x20);
	if (acode == 0xDE)						// Thorn
		return 'P' + (code & 0x20);			// well, it sort of looks like a 'P'
	return code;
}